

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd.c
# Opt level: O3

void gdImageHLine(gdImagePtr im,int y,int x1,int x2,int col)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  bool bVar7;
  
  uVar1 = im->thick;
  if ((int)uVar1 < 2) {
    iVar2 = x1;
    if (x1 < x2) {
      iVar2 = x2;
    }
    if (x2 < x1) {
      x1 = x2;
    }
    do {
      gdImageSetPixel(im,x1,y,col);
      x1 = x1 + 1;
    } while (iVar2 + 1 != x1);
  }
  else {
    iVar4 = y - (uVar1 >> 1);
    iVar2 = ~(uVar1 >> 1) + uVar1 + y;
    if (iVar4 == iVar2 && x1 == x2) {
      gdImageSetPixel(im,x2,iVar4,col);
      return;
    }
    iVar3 = x2;
    if (x2 < x1) {
      iVar3 = x1;
    }
    if (x1 < x2) {
      x2 = x1;
    }
    iVar6 = iVar2;
    if (iVar4 < iVar2) {
      iVar6 = iVar4;
    }
    if (x2 < 1) {
      x2 = 0;
    }
    iVar5 = im->sx + -1;
    if (iVar3 < im->sx) {
      iVar5 = iVar3;
    }
    if (iVar6 < 1) {
      iVar6 = 0;
    }
    if (x2 <= iVar5) {
      if (iVar2 < iVar4) {
        iVar2 = iVar4;
      }
      iVar4 = im->sy + -1;
      if (iVar2 < im->sy) {
        iVar4 = iVar2;
      }
      do {
        iVar2 = iVar6;
        if (iVar6 <= iVar4) {
          do {
            gdImageSetPixel(im,x2,iVar2,col);
            iVar2 = iVar2 + 1;
          } while (iVar4 + 1 != iVar2);
        }
        bVar7 = x2 != iVar5;
        x2 = x2 + 1;
      } while (bVar7);
    }
  }
  return;
}

Assistant:

static void gdImageHLine(gdImagePtr im, int y, int x1, int x2, int col)
{
	if (im->thick > 1) {
		int thickhalf = im->thick >> 1;
		_gdImageFilledHRectangle(im, x1, y - thickhalf, x2, y + im->thick - thickhalf - 1, col);
	} else {
		if (x2 < x1) {
			int t = x2;
			x2 = x1;
			x1 = t;
		}

		for (; x1 <= x2; x1++) {
			gdImageSetPixel(im, x1, y, col);
		}
	}
	return;
}